

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O0

TranslatorInfo * __thiscall
gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
          (MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *this,
          GlobalHandle *searchValue)

{
  bool bVar1;
  pointer pvVar2;
  vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  *in_RDI;
  const_iterator fnd;
  unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false> local_28;
  _Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false> local_20 [3];
  pointer local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x67ccb6);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_8 = (pointer)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false,_false>
                           *)0x67ccef);
    std::
    vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
    ::operator[](in_RDI,pvVar2->second);
    local_8 = std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
              ::get((unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                     *)in_RDI);
  }
  return local_8;
}

Assistant:

VType* find(const searchType& searchValue) const
    {
        auto fnd = lookup.find(searchValue);
        if (fnd != lookup.end()) {
            return dataStorage[fnd->second].get();
        }
        return nullptr;
    }